

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

int __thiscall Fluid::init(Fluid *this,EVP_PKEY_CTX *ctx)

{
  Buffer *pBVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  VAO *pVVar5;
  Program *pPVar6;
  Program *extraout_RAX;
  int iVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_24;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  circle;
  undefined8 local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  float local_90;
  float local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_68;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_48;
  
  init_ssbos(this);
  local_68.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = this->num_circle_vertices;
  if (0 < iVar4) {
    iVar7 = 0;
    do {
      local_90 = ((float)iVar7 / (float)iVar4) * 3.1415927;
      local_90 = local_90 + local_90;
      local_8c = sinf(local_90);
      local_150._4_4_ = cosf(local_90);
      local_150._0_4_ = local_8c;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&local_68,(vec<2,_float,_(glm::qualifier)0> *)&local_150);
      iVar7 = iVar7 + 1;
      iVar4 = this->num_circle_vertices;
    } while (iVar7 < iVar4);
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_48,&local_68);
  gfx::Buffer::set_data<glm::vec<2,float,(glm::qualifier)0>>(&this->circle_verts,&local_48,0x88e4);
  if (local_48.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVVar5 = gfx::VAO::bind_attrib(&this->vao,&this->circle_verts,2,0x1406,0);
  pBVar1 = &this->particle_ssbo;
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x10,0x30,3,0x1406,1);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x20,0x30,3,0x1406,1);
  gfx::VAO::bind_attrib(pVVar5,pBVar1,0,0x30,4,0x1406,1);
  pBVar1 = &this->grid_ssbo;
  pVVar5 = gfx::VAO::bind_attrib(&this->grid_vao,pBVar1,0,0x50,3,0x1406,0);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x10,0x50,3,0x1406,0);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0xc,0x50,1,0x1404,0);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x1c,0x50,1,0x1406,0);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x2c,0x50,4,0x1406,0);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x40,0x50,1,0x1406,0);
  gfx::VAO::bind_attrib(pVVar5,pBVar1,0x44,0x50,1,0x1404,0);
  pBVar1 = &this->debug_lines_ssbo;
  pVVar5 = gfx::VAO::bind_attrib(&this->debug_lines_vao,pBVar1,0x10,0x30,3,0x1406,0);
  pVVar5 = gfx::VAO::bind_attrib(pVVar5,pBVar1,0x20,0x30,3,0x1406,0);
  gfx::VAO::bind_attrib(pVVar5,pBVar1,0,0x30,4,0x1406,0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"reset_grid.cs.glsl","");
  srcs._M_len = 2;
  srcs._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->reset_grid_program,srcs);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"atomic.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"common.glsl","");
  plVar11 = local_100;
  local_110[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"p2g_common.glsl","");
  plVar10 = local_e0;
  local_f0[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"p2g_accumulate.cs.glsl","");
  srcs_00._M_len = 4;
  srcs_00._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->p2g_accumulate_program,srcs_00);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x80;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"atomic.glsl","");
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"common.glsl","");
  local_110[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"p2g_common.glsl","");
  plVar10 = local_e0;
  local_f0[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"p2g_apply.cs.glsl","");
  srcs_01._M_len = 4;
  srcs_01._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->p2g_apply_program,srcs_01);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x80;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"grid_to_particle.cs.glsl","")
  ;
  srcs_02._M_len = 2;
  srcs_02._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->grid_to_particle_program,srcs_02);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"extrapolate.cs.glsl","");
  srcs_03._M_len = 2;
  srcs_03._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->extrapolate_program,srcs_03);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"set_vel_known.cs.glsl","");
  srcs_04._M_len = 2;
  srcs_04._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->set_vel_known_program,srcs_04);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"enforce_boundary.cs.glsl","")
  ;
  local_110[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"body_forces.cs.glsl","");
  srcs_05._M_len = 3;
  srcs_05._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->body_forces_program,srcs_05);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"setup_project.cs.glsl","");
  plVar11 = local_100;
  local_110[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"compute_divergence.cs.glsl","");
  plVar10 = local_e0;
  local_f0[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"build_a.cs.glsl","");
  srcs_06._M_len = 4;
  srcs_06._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->setup_grid_project_program,srcs_06);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x80;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"jacobi_iterate.cs.glsl","");
  srcs_07._M_len = 2;
  srcs_07._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->jacobi_iterate_program,srcs_07);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"pressure_to_guess.cs.glsl","");
  srcs_08._M_len = 2;
  srcs_08._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->pressure_to_guess_program,srcs_08);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"pressure_update.cs.glsl","");
  srcs_09._M_len = 2;
  srcs_09._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->pressure_update_program,srcs_09);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"rand.glsl","");
  local_110[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"particle_advect.cs.glsl","");
  srcs_10._M_len = 3;
  srcs_10._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::compute(&this->particle_advect_program,srcs_10);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  paVar2 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"particles.vs.glsl","");
  srcs_11._M_len = 1;
  srcs_11._M_array = &local_d0;
  pPVar6 = gfx::Program::vertex(&this->program,srcs_11);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"lighting.glsl","");
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"particles.fs.glsl","");
  srcs_12._M_len = 2;
  srcs_12._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::fragment(pPVar6,srcs_12);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"grid.vs.glsl","");
  srcs_13._M_len = 2;
  srcs_13._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::vertex(&this->grid_program,srcs_13);
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"common.glsl","");
  plVar11 = local_a0;
  local_b0[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"grid.gs.glsl","");
  srcs_14._M_len = 2;
  srcs_14._M_array = &local_d0;
  pPVar6 = gfx::Program::geometry(pPVar6,srcs_14);
  paVar3 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"grid.fs.glsl","");
  srcs_15._M_len = 1;
  srcs_15._M_array = &local_88;
  pPVar6 = gfx::Program::fragment(pPVar6,srcs_15);
  gfx::Program::compile(pPVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  lVar9 = -0x40;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"debug_lines.vs.glsl","");
  srcs_16._M_len = 1;
  srcs_16._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::vertex(&this->debug_lines_program,srcs_16);
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"debug_lines.gs.glsl","");
  srcs_17._M_len = 1;
  srcs_17._M_array = &local_d0;
  pPVar6 = gfx::Program::geometry(pPVar6,srcs_17);
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"debug_lines.fs.glsl","");
  srcs_18._M_len = 1;
  srcs_18._M_array = &local_88;
  pPVar6 = gfx::Program::fragment(pPVar6,srcs_18);
  gfx::Program::compile(pPVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != (vec<2,_float,_(glm::qualifier)0>)&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"particles.vs.glsl","");
  srcs_19._M_len = 1;
  srcs_19._M_array = &local_d0;
  pPVar6 = gfx::Program::vertex(&this->ssf_spheres_program,srcs_19);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"common.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"ssf_spheres.fs.glsl","");
  srcs_20._M_len = 2;
  srcs_20._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::fragment(pPVar6,srcs_20);
  gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"screen_quad.vs.glsl","");
  srcs_21._M_len = 1;
  srcs_21._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::vertex(&this->ssf_smooth_program,srcs_21);
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ssf_smooth.fs.glsl","");
  srcs_22._M_len = 1;
  srcs_22._M_array = &local_d0;
  pPVar6 = gfx::Program::fragment(pPVar6,srcs_22);
  gfx::Program::compile(pPVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != (vec<2,_float,_(glm::qualifier)0>)&local_140) {
    operator_delete((void *)local_150,local_140._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"screen_quad.vs.glsl","");
  srcs_23._M_len = 1;
  srcs_23._M_array = &local_d0;
  pPVar6 = gfx::Program::vertex(&this->ssf_shade_program,srcs_23);
  local_150 = (vec<2,_float,_(glm::qualifier)0>)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"lighting.glsl","");
  plVar8 = local_120;
  local_130[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"ssf_shade.fs.glsl","");
  srcs_24._M_len = 2;
  srcs_24._M_array = (iterator)&local_150;
  pPVar6 = gfx::Program::fragment(pPVar6,srcs_24);
  pPVar6 = gfx::Program::compile(pPVar6);
  lVar9 = -0x40;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
      pPVar6 = extraout_RAX;
    }
    iVar4 = (int)pPVar6;
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EAX;
  }
  if (local_68.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

void init() {
        init_ssbos();

        // graphics initialization
        // circle vertices (for triangle fan)
        std::vector<glm::vec2> circle;
        for (int i = 0; i < num_circle_vertices; ++i) {
            const float f = static_cast<float>(i) / num_circle_vertices * glm::pi<float>() * 2.0;
            circle.emplace_back(glm::vec2(glm::sin(f), glm::cos(f)));
        }
        circle_verts.set_data(circle);

        vao.bind_attrib(circle_verts, 2, GL_FLOAT)
           .bind_attrib(particle_ssbo, offsetof(Particle, pos), sizeof(Particle), 3, GL_FLOAT, gfx::INSTANCED)
           .bind_attrib(particle_ssbo, offsetof(Particle, vel), sizeof(Particle), 3, GL_FLOAT, gfx::INSTANCED)
           .bind_attrib(particle_ssbo, offsetof(Particle, color), sizeof(Particle), 4, GL_FLOAT, gfx::INSTANCED);
        
        grid_vao.bind_attrib(grid_ssbo, offsetof(GridCell, pos), sizeof(GridCell), 3, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, vel), sizeof(GridCell), 3, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, type), sizeof(GridCell), 1, GL_INT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, rhs), sizeof(GridCell), 1, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, a_diag), sizeof(GridCell), 4, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, pressure), sizeof(GridCell), 1, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, vel_unknown), sizeof(GridCell), 1, GL_INT, gfx::NOT_INSTANCED);

        debug_lines_vao.bind_attrib(debug_lines_ssbo, offsetof(DebugLine, a), sizeof(DebugLine), 3, GL_FLOAT, gfx::NOT_INSTANCED)
            .bind_attrib(debug_lines_ssbo, offsetof(DebugLine, b), sizeof(DebugLine), 3, GL_FLOAT, gfx::NOT_INSTANCED)
            .bind_attrib(debug_lines_ssbo, offsetof(DebugLine, color), sizeof(DebugLine), 4, GL_FLOAT, gfx::NOT_INSTANCED);
        
        
        reset_grid_program.compute({"common.glsl", "reset_grid.cs.glsl"}).compile();
        p2g_accumulate_program.compute({"atomic.glsl", "common.glsl", "p2g_common.glsl", "p2g_accumulate.cs.glsl"}).compile();
        p2g_apply_program.compute({"atomic.glsl", "common.glsl", "p2g_common.glsl", "p2g_apply.cs.glsl"}).compile();
        grid_to_particle_program.compute({"common.glsl", "grid_to_particle.cs.glsl"}).compile();
        extrapolate_program.compute({"common.glsl", "extrapolate.cs.glsl"}).compile();
        set_vel_known_program.compute({"common.glsl", "set_vel_known.cs.glsl"}).compile();
        body_forces_program.compute({"common.glsl", "enforce_boundary.cs.glsl", "body_forces.cs.glsl"}).compile();
        setup_grid_project_program.compute({"common.glsl", "setup_project.cs.glsl", "compute_divergence.cs.glsl", "build_a.cs.glsl"}).compile();
        jacobi_iterate_program.compute({"common.glsl", "jacobi_iterate.cs.glsl"}).compile();
        pressure_to_guess_program.compute({"common.glsl", "pressure_to_guess.cs.glsl"}).compile();
        pressure_update_program.compute({"common.glsl", "pressure_update.cs.glsl"}).compile();
        particle_advect_program.compute({"common.glsl", "rand.glsl", "particle_advect.cs.glsl"}).compile();
        
        program.vertex({"particles.vs.glsl"}).fragment({"lighting.glsl", "particles.fs.glsl"}).compile();
        grid_program.vertex({"common.glsl", "grid.vs.glsl"}).geometry({"common.glsl", "grid.gs.glsl"}).fragment({"grid.fs.glsl"}).compile();
        debug_lines_program.vertex({"debug_lines.vs.glsl"}).geometry({"debug_lines.gs.glsl"}).fragment({"debug_lines.fs.glsl"}).compile();

        ssf_spheres_program.vertex({"particles.vs.glsl"}).fragment({"common.glsl", "ssf_spheres.fs.glsl"}).compile();
        ssf_smooth_program.vertex({"screen_quad.vs.glsl"}).fragment({"ssf_smooth.fs.glsl"}).compile();
        ssf_shade_program.vertex({"screen_quad.vs.glsl"}).fragment({"lighting.glsl", "ssf_shade.fs.glsl"}).compile();
    }